

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

void __thiscall leveldb::MemTable::~MemTable(MemTable *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/memtable.cc"
                  ,0x18,"leveldb::MemTable::~MemTable()");
  }
  Comparator::~Comparator((Comparator *)&this->table_);
  Arena::~Arena(&this->arena_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Comparator::~Comparator((Comparator *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

MemTable::~MemTable() { assert(refs_ == 0); }